

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O2

int __thiscall CJSON::UTF8BitShift(CJSON *this,uchar c)

{
  int iVar1;
  byte bVar2;
  
  bVar2 = ~c;
  if ((bVar2 & 0xf0) == 0) {
    iVar1 = 5;
  }
  else if ((bVar2 & 0xe0) == 0) {
    iVar1 = 4;
  }
  else {
    if ((bVar2 & 0xc0) != 0) {
      return (int)(c >> 6 & 2);
    }
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

inline int UTF8BitShift(unsigned char c)
        {
            if((c & 0xF0) == 0xF0)
                return 5;
            if((c & 0xE0) == 0xE0)
                return 4;
            if((c & 0xC0) == 0xC0)
                return 3;
            if((c & 0x80) == 0x80)
                return 2;

            return 0;
        }